

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  TPZStructMatrix *pTVar1;
  TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *in_RDI;
  TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0x130);
  TPZBSpStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZBSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZBSpStructMatrix(*this);
}